

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathWrapString(xmlChar *val)

{
  xmlXPathObjectPtr ret;
  xmlChar *val_local;
  
  val_local = (xmlChar *)(*xmlMalloc)(0x48);
  if (val_local == (xmlChar *)0x0) {
    xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating string object\n");
    val_local = (xmlChar *)0x0;
  }
  else {
    memset(val_local,0,0x48);
    val_local[0] = '\x04';
    val_local[1] = '\0';
    val_local[2] = '\0';
    val_local[3] = '\0';
    *(xmlChar **)(val_local + 0x20) = val;
  }
  return (xmlXPathObjectPtr)val_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPathWrapString (xmlChar *val) {
    xmlXPathObjectPtr ret;

    ret = (xmlXPathObjectPtr) xmlMalloc(sizeof(xmlXPathObject));
    if (ret == NULL) {
        xmlXPathErrMemory(NULL, "creating string object\n");
	return(NULL);
    }
    memset(ret, 0 , sizeof(xmlXPathObject));
    ret->type = XPATH_STRING;
    ret->stringval = val;
#ifdef XP_DEBUG_OBJ_USAGE
    xmlXPathDebugObjUsageRequested(NULL, XPATH_STRING);
#endif
    return(ret);
}